

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O1

void __thiscall
cbtAlignedObjectArray<cbtHashString>::reserve(cbtAlignedObjectArray<cbtHashString> *this,int _Count)

{
  char *pcVar1;
  long *plVar2;
  int iVar3;
  cbtHashString *pcVar4;
  long lVar5;
  cbtHashString *pcVar6;
  long lVar7;
  
  if (this->m_capacity < _Count) {
    if (_Count == 0) {
      pcVar6 = (cbtHashString *)0x0;
    }
    else {
      pcVar6 = (cbtHashString *)cbtAlignedAllocInternal((long)_Count * 0x28,0x10);
    }
    iVar3 = this->m_size;
    if (0 < (long)iVar3) {
      lVar7 = 0;
      do {
        pcVar4 = this->m_data;
        pcVar1 = (pcVar6->m_string1).field_2._M_local_buf + lVar7;
        *(char **)(pcVar1 + -0x10) = pcVar1;
        lVar5 = *(long *)((long)&(pcVar4->m_string1)._M_dataplus._M_p + lVar7);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)&(pcVar6->m_string1)._M_dataplus._M_p + lVar7),lVar5,
                   *(long *)((long)&(pcVar4->m_string1)._M_string_length + lVar7) + lVar5);
        *(undefined4 *)(pcVar1 + 0x10) = *(undefined4 *)((long)&pcVar4->m_hash + lVar7);
        lVar7 = lVar7 + 0x28;
      } while ((long)iVar3 * 0x28 != lVar7);
    }
    iVar3 = this->m_size;
    if (0 < (long)iVar3) {
      lVar7 = 0;
      do {
        plVar2 = (long *)((this->m_data->m_string1).field_2._M_local_buf + lVar7);
        if (plVar2 != (long *)plVar2[-2]) {
          operator_delete((long *)plVar2[-2],*plVar2 + 1);
        }
        lVar7 = lVar7 + 0x28;
      } while ((long)iVar3 * 0x28 != lVar7);
    }
    if (this->m_data != (cbtHashString *)0x0) {
      if (this->m_ownsMemory == true) {
        cbtAlignedFreeInternal(this->m_data);
      }
      this->m_data = (cbtHashString *)0x0;
    }
    this->m_ownsMemory = true;
    this->m_data = pcVar6;
    this->m_capacity = _Count;
  }
  return;
}

Assistant:

SIMD_FORCE_INLINE void reserve(int _Count)
	{  // determine new minimum length of allocated storage
		if (capacity() < _Count)
		{  // not enough room, reallocate
			T* s = (T*)allocate(_Count);

			copy(0, size(), s);

			destroy(0, size());

			deallocate();

			//PCK: added this line
			m_ownsMemory = true;

			m_data = s;

			m_capacity = _Count;
		}
	}